

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# automations.cpp
# Opt level: O1

void __thiscall rtosc::AutomationMgr::setparameternumber(AutomationMgr *this,uint type,int value)

{
  if (0x61 < (int)type) {
    if (type == 0x62) {
      (this->NRPN).parlo = value;
    }
    else {
      if (type != 99) {
        return;
      }
      (this->NRPN).parhi = value;
    }
    (this->NRPN).valhi = -1;
    (this->NRPN).vallo = -1;
    return;
  }
  if (type == 6) {
    if ((-1 < (this->NRPN).parhi) && (-1 < (this->NRPN).parlo)) {
      (this->NRPN).valhi = value;
    }
  }
  else if (((type == 0x26) && (-1 < (this->NRPN).parhi)) && (-1 < (this->NRPN).parlo)) {
    (this->NRPN).vallo = value;
    return;
  }
  return;
}

Assistant:

void AutomationMgr::setparameternumber(unsigned int type, int value)
{
    switch(type) {
        case C_nrpnhi:
            NRPN.parhi = value;
            NRPN.valhi = -1;
            NRPN.vallo = -1; //clear the values
            break;
        case C_nrpnlo:
            NRPN.parlo = value;
            NRPN.valhi = -1;
            NRPN.vallo = -1; //clear the values
            break;
        case C_dataentryhi:
            if((NRPN.parhi >= 0) && (NRPN.parlo >= 0))
                NRPN.valhi = value;
            break;
        case C_dataentrylo:
            if((NRPN.parhi >= 0) && (NRPN.parlo >= 0))
                NRPN.vallo = value;
            break;
    }
}